

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O0

void * __thiscall
allocator_tests::TestLockedPageAllocator::AllocateLocked
          (TestLockedPageAllocator *this,size_t len,bool *lockingSuccess)

{
  long lVar1;
  undefined1 *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0;
  if (*(int *)(in_RDI + 8) < 1) {
    local_10 = (void *)0x0;
  }
  else {
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -1;
    if (0 < *(int *)(in_RDI + 0xc)) {
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + -1;
      *in_RDX = 1;
    }
    local_10 = (void *)((long)(*(int *)(in_RDI + 8) << 0x18) + 0x8000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

void* AllocateLocked(size_t len, bool *lockingSuccess) override
    {
        *lockingSuccess = false;
        if (count > 0) {
            --count;

            if (lockedcount > 0) {
                --lockedcount;
                *lockingSuccess = true;
            }

            return reinterpret_cast<void*>(uint64_t{static_cast<uint64_t>(0x08000000) + (count << 24)}); // Fake address, do not actually use this memory
        }
        return nullptr;
    }